

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutCut.c
# Opt level: O0

void Cut_CutPrint(Cut_Cut_t *pCut,int fSeq)

{
  int local_18;
  int i;
  int fSeq_local;
  Cut_Cut_t *pCut_local;
  
  if (*(uint *)pCut >> 0x1c == 0) {
    __assert_fail("pCut->nLeaves > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutCut.c"
                  ,0x117,"void Cut_CutPrint(Cut_Cut_t *, int)");
  }
  printf("%d : {",(ulong)(*(uint *)pCut >> 0x1c));
  for (local_18 = 0; local_18 < (int)(*(uint *)pCut >> 0x1c); local_18 = local_18 + 1) {
    if (fSeq == 0) {
      printf(" %d",(ulong)*(uint *)(&pCut[1].field_0x0 + (long)local_18 * 4));
    }
    else {
      printf(" %d",(ulong)(uint)(*(int *)(&pCut[1].field_0x0 + (long)local_18 * 4) >> 8));
      if ((*(uint *)(&pCut[1].field_0x0 + (long)local_18 * 4) & 0xff) != 0) {
        printf("(%d)",(ulong)(*(uint *)(&pCut[1].field_0x0 + (long)local_18 * 4) & 0xff));
      }
    }
  }
  printf(" }");
  return;
}

Assistant:

void Cut_CutPrint( Cut_Cut_t * pCut, int fSeq )
{
    int i;
    assert( pCut->nLeaves > 0 );
    printf( "%d : {", pCut->nLeaves );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
    {
        if ( fSeq )
        {
            printf( " %d", pCut->pLeaves[i] >> CUT_SHIFT );
            if ( pCut->pLeaves[i] & CUT_MASK )
                printf( "(%d)", pCut->pLeaves[i] & CUT_MASK );
        }
        else
            printf( " %d", pCut->pLeaves[i] );
    }
    printf( " }" );
//    printf( "\nSign = " );
//    Extra_PrintBinary( stdout, &pCut->uSign, 32 );
}